

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utypes.h
# Opt level: O1

void __thiscall icu_63::Calendar::computeWeekFields(Calendar *this,UErrorCode *ec)

{
  UCalendarDaysOfWeek UVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int32_t iVar8;
  int iVar9;
  
  if (*ec < U_ILLEGAL_ARGUMENT_ERROR) {
    iVar4 = this->fFields[0x13];
    iVar7 = this->fFields[6];
    iVar9 = this->fFields[7];
    UVar1 = this->fFirstDayOfWeek;
    iVar2 = iVar7 + UVar1;
    iVar3 = iVar9 - iVar2;
    iVar2 = (int)((ulong)((long)((iVar9 - iVar2) + 0x1b59) * -0x6db6db6d) >> 0x20) + iVar3 + 0x1b59;
    iVar2 = ((iVar2 >> 2) - (iVar2 >> 0x1f)) * -7 + iVar3 + 0x1b59;
    iVar3 = iVar7 + iVar2 + (int)((ulong)((long)(iVar7 + iVar2 + -1) * -0x6db6db6d) >> 0x20) + -1;
    iVar8 = (uint)((int)(uint)this->fMinimalDaysInFirstWeek <= 7 - iVar2) +
            ((iVar3 >> 2) - (iVar3 >> 0x1f));
    if (iVar8 == 0) {
      iVar4 = iVar4 + -1;
      iVar3 = (*(this->super_UObject)._vptr_UObject[0x23])(this);
      iVar3 = iVar3 + iVar7;
      iVar7 = iVar9 - (this->fFirstDayOfWeek + iVar3);
      iVar2 = (int)((ulong)((long)(iVar7 + 1) * -0x6db6db6d) >> 0x20) + iVar7 + 1;
      iVar2 = ((iVar2 >> 2) - (iVar2 >> 0x1f)) * -7;
      iVar5 = iVar7 + iVar2 + 1;
      iVar2 = iVar7 + 8 + iVar2;
      if (-1 < iVar5) {
        iVar2 = iVar5;
      }
      iVar7 = (int)((ulong)((long)(iVar2 + iVar3 + -1) * -0x6db6db6d) >> 0x20) + iVar3 + iVar2 + -1;
      iVar8 = (((iVar7 >> 2) - (iVar7 >> 0x1f)) + 1) -
              (uint)(7U - iVar2 < (uint)this->fMinimalDaysInFirstWeek);
    }
    else {
      iVar2 = (*(this->super_UObject)._vptr_UObject[0x23])(this);
      if (iVar2 + -5 <= iVar7) {
        iVar3 = iVar9 - UVar1;
        iVar5 = (int)((ulong)((long)(iVar3 + 7) * -0x6db6db6d) >> 0x20) + iVar3 + 7;
        iVar5 = iVar3 + ((iVar5 >> 2) - (iVar5 >> 0x1f)) * -7 + 7;
        iVar3 = (iVar5 - iVar7) + iVar2;
        iVar6 = iVar3 % 7;
        iVar3 = iVar3 % 7 + 7;
        if (-1 < iVar6) {
          iVar3 = iVar6;
        }
        if ((uint)this->fMinimalDaysInFirstWeek <= 6U - iVar3) {
          iVar7 = (iVar7 - iVar5) + 7;
          if (iVar2 < iVar7) {
            iVar8 = 1;
          }
          iVar4 = iVar4 + (uint)(iVar2 < iVar7);
        }
      }
    }
    this->fFields[3] = iVar8;
    this->fFields[0x11] = iVar4;
    iVar2 = this->fFields[5];
    iVar9 = iVar9 - (this->fFirstDayOfWeek + iVar2);
    iVar4 = (int)((ulong)((long)(iVar9 + 1) * -0x6db6db6d) >> 0x20) + iVar9 + 1;
    iVar4 = ((iVar4 >> 2) - (iVar4 >> 0x1f)) * -7;
    iVar7 = iVar9 + iVar4 + 1;
    iVar4 = iVar9 + 8 + iVar4;
    if (-1 < iVar7) {
      iVar4 = iVar7;
    }
    this->fFields[4] =
         ((iVar4 + iVar2 + -1) / 7 + 1) - (uint)(7U - iVar4 < (uint)this->fMinimalDaysInFirstWeek);
    iVar2 = iVar2 + (int)((ulong)((long)(iVar2 + -1) * -0x6db6db6d) >> 0x20) + -1;
    this->fFields[8] = ((iVar2 >> 2) - (iVar2 >> 0x1f)) + 1;
    return;
  }
  return;
}

Assistant:

static
    inline UBool U_FAILURE(UErrorCode code) { return (UBool)(code>U_ZERO_ERROR); }